

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltests.c
# Opt level: O1

int gc_state(lua_State *L)

{
  uint uVar1;
  global_State *pgVar2;
  int *piVar3;
  int iVar4;
  int iVar5;
  
  iVar5 = 1;
  iVar4 = luaL_checkoption(L,1,"",gc_state::statenames);
  pgVar2 = L->l_G;
  if (iVar4 == 9) {
    lua_pushstring(L,gc_state::statenames[pgVar2->gcstate]);
  }
  else {
    uVar1 = gc_state::states[iVar4];
    if (pgVar2->gckind == '\x01') {
      luaL_error(L,"cannot change states in generational mode");
    }
    iVar4 = **(int **)&L[-1].hookmask;
    **(int **)&L[-1].hookmask = iVar4 + 1;
    if (iVar4 != 0) {
      __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                    ,0x319,"int gc_state(lua_State *)");
    }
    if ((int)uVar1 < (int)(uint)pgVar2->gcstate) {
      luaC_runtilstate(L,0x100);
    }
    luaC_runtilstate(L,1 << (uVar1 & 0x1f));
    if (uVar1 != L->l_G->gcstate) {
      __assert_fail("(L->l_G)->gcstate == option",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                    ,0x31e,"int gc_state(lua_State *)");
    }
    piVar3 = *(int **)&L[-1].hookmask;
    iVar5 = 0;
    *piVar3 = *piVar3 + -1;
    if (*piVar3 != 0) {
      __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                    ,799,"int gc_state(lua_State *)");
    }
  }
  return iVar5;
}

Assistant:

static int gc_state (lua_State *L) {
  static const char *statenames[] = {
    "propagate", "atomic", "enteratomic", "sweepallgc", "sweepfinobj",
    "sweeptobefnz", "sweepend", "callfin", "pause", ""};
  static const int states[] = {
    GCSpropagate, GCSenteratomic, GCSatomic, GCSswpallgc, GCSswpfinobj,
    GCSswptobefnz, GCSswpend, GCScallfin, GCSpause, -1};
  int option = states[luaL_checkoption(L, 1, "", statenames)];
  if (option == -1) {
    lua_pushstring(L, statenames[G(L)->gcstate]);
    return 1;
  }
  else {
    global_State *g = G(L);
    if (G(L)->gckind == KGC_GEN)
      luaL_error(L, "cannot change states in generational mode");
    lua_lock(L);
    if (option < g->gcstate) {  /* must cross 'pause'? */
      luaC_runtilstate(L, bitmask(GCSpause));  /* run until pause */
    }
    luaC_runtilstate(L, bitmask(option));
    lua_assert(G(L)->gcstate == option);
    lua_unlock(L);
    return 0;
  }
}